

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

DLS_Data * Timidity::LoadDLS(FILE *src)

{
  RIFF_Chunk *pRVar1;
  DWORD local_30;
  DWORD magic;
  DLS_Data *data;
  RIFF_Chunk *chunk;
  FILE *src_local;
  
  src_local = (FILE *)malloc(0x50);
  if (src_local == (FILE *)0x0) {
    src_local = (FILE *)0x0;
  }
  else {
    memset(src_local,0,0x50);
    pRVar1 = LoadRIFF(src);
    *(RIFF_Chunk **)src_local = pRVar1;
    if (*(long *)src_local == 0) {
      FreeDLS((DLS_Data *)src_local);
      src_local = (FILE *)0x0;
    }
    else {
      for (data = *(DLS_Data **)(*(long *)src_local + 0x18); data != (DLS_Data *)0x0;
          data = (DLS_Data *)data->ptblList) {
        if (*(int *)&data->chunk == 0x5453494c) {
          local_30 = data->cInstruments;
        }
        else {
          local_30 = *(DWORD *)&data->chunk;
        }
        if (local_30 == 0x4f464e49) {
          Parse_INFO_DLS((DLS_Data *)src_local,(RIFF_Chunk *)data);
        }
        else if (local_30 == 0x686c6f63) {
          Parse_colh((DLS_Data *)src_local,(RIFF_Chunk *)data);
        }
        else if (local_30 == 0x6c627470) {
          Parse_ptbl((DLS_Data *)src_local,(RIFF_Chunk *)data);
        }
        else if (local_30 == 0x6c707677) {
          Parse_wvpl((DLS_Data *)src_local,(RIFF_Chunk *)data);
        }
        else if (local_30 == 0x736e696c) {
          Parse_lins((DLS_Data *)src_local,(RIFF_Chunk *)data);
        }
      }
    }
  }
  return (DLS_Data *)src_local;
}

Assistant:

DLS_Data *LoadDLS(FILE *src)
{
	RIFF_Chunk *chunk;
	DLS_Data *data = (DLS_Data *)malloc(sizeof(*data));
	if ( !data ) {
		__Sound_SetError(ERR_OUT_OF_MEMORY);
		return NULL;
	}
	memset(data, 0, sizeof(*data));

	data->chunk = LoadRIFF(src);
	if ( !data->chunk ) {
		FreeDLS(data);
		return NULL;
	}

	for ( chunk = data->chunk->child; chunk; chunk = chunk->next ) {
		DWORD magic = (chunk->magic == FOURCC_LIST) ? chunk->subtype : chunk->magic;
		switch(magic) {
			case FOURCC_COLH:
				Parse_colh(data, chunk);
				break;
			case FOURCC_LINS:
				Parse_lins(data, chunk);
				break;
			case FOURCC_PTBL:
				Parse_ptbl(data, chunk);
				break;
			case FOURCC_WVPL:
				Parse_wvpl(data, chunk);
				break;
			case FOURCC_INFO:
				Parse_INFO_DLS(data, chunk);
				break;
		}
	}
	return data;
}